

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode set_userpass(connectdata *conn,char *user,char *passwd)

{
  char *pcVar1;
  char *passwd_local;
  char *user_local;
  connectdata *conn_local;
  
  if (((conn->handler->flags & 0x20) == 0) || (((conn->bits).user_passwd & 1U) != 0)) {
    pcVar1 = (*Curl_cstrdup)(user);
    conn->user = pcVar1;
    if (conn->user == (char *)0x0) {
      conn->passwd = (char *)0x0;
    }
    else {
      pcVar1 = (*Curl_cstrdup)(passwd);
      conn->passwd = pcVar1;
    }
  }
  else {
    pcVar1 = (*Curl_cstrdup)("anonymous");
    conn->user = pcVar1;
    if (conn->user == (char *)0x0) {
      conn->passwd = (char *)0x0;
    }
    else {
      pcVar1 = (*Curl_cstrdup)("ftp@example.com");
      conn->passwd = pcVar1;
    }
  }
  if ((conn->user == (char *)0x0) || (conn->passwd == (char *)0x0)) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode set_userpass(struct connectdata *conn,
                             const char *user, const char *passwd)
{
  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) &&
     !conn->bits.user_passwd) {

    conn->user = strdup(CURL_DEFAULT_USER);
    if(conn->user)
      conn->passwd = strdup(CURL_DEFAULT_PASSWORD);
    else
      conn->passwd = NULL;
    /* This is the default password, so DON'T set conn->bits.user_passwd */
  }
  else {
    /* store user + password, zero-length if not set */
    conn->user = strdup(user);
    if(conn->user)
      conn->passwd = strdup(passwd);
    else
      conn->passwd = NULL;
  }
  if(!conn->user || !conn->passwd)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}